

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_longnames.cpp
# Opt level: O2

LongNameHandler *
icu_63::number::impl::LongNameHandler::forCurrencyLongNames
          (Locale *loc,CurrencyUnit *currency,PluralRules *rules,MicroPropsGenerator *parent,
          UErrorCode *status)

{
  char *locale;
  LongNameHandler *this;
  long lVar1;
  char *pluralCount;
  UChar *text;
  UnicodeString *outArray;
  UBool isChoiceFormat;
  int32_t longNameLen;
  CurrencyUnit *local_2e8;
  Locale *local_2e0;
  LocalUResourceBundlePointer unitsBundle;
  PluralTableSink sink;
  UnicodeString local_2b8;
  UnicodeString local_278;
  UnicodeString local_238 [8];
  
  local_2e8 = currency;
  local_2e0 = loc;
  this = (LongNameHandler *)UMemory::operator_new((UMemory *)0x2c0,(size_t)currency);
  if (this == (LongNameHandler *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
    this = (LongNameHandler *)0x0;
  }
  else {
    LongNameHandler(this,rules,parent);
    lVar1 = 0;
    do {
      *(undefined ***)((long)&local_238[0].super_Replaceable.super_UObject._vptr_UObject + lVar1) =
           &PTR__UnicodeString_003a7268;
      *(undefined2 *)((long)&local_238[0].fUnion + lVar1) = 2;
      lVar1 = lVar1 + 0x40;
    } while (lVar1 != 0x200);
    outArray = local_238;
    anon_unknown.dwarf_1665be::PluralTableSink::PluralTableSink(&sink,outArray);
    unitsBundle.super_LocalPointerBase<UResourceBundle>.ptr =
         (LocalPointerBase<UResourceBundle>)ures_open_63("icudt63l-curr",local_2e0->fullName,status)
    ;
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      ures_getAllItemsWithFallback_63
                ((UResourceBundle *)unitsBundle.super_LocalPointerBase<UResourceBundle>.ptr,
                 "CurrencyUnitPatterns",&sink.super_ResourceSink,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        local_2e8 = (CurrencyUnit *)&(local_2e8->super_MeasureUnit).field_0x14;
        for (lVar1 = 0; lVar1 != 6; lVar1 = lVar1 + 1) {
          if ((undefined1  [56])((undefined1  [56])outArray->fUnion & (undefined1  [56])0x1) ==
              (undefined1  [56])0x0) {
            isChoiceFormat = '\0';
            longNameLen = 0;
            locale = local_2e0->fullName;
            pluralCount = StandardPlural::getKeyword((Form)lVar1);
            text = ucurr_getPluralName_63
                             ((UChar *)local_2e8,locale,&isChoiceFormat,pluralCount,&longNameLen,
                              status);
            UnicodeString::UnicodeString(&local_278,L"{1}");
            UnicodeString::UnicodeString(&local_2b8,text,longNameLen);
            UnicodeString::findAndReplace(outArray,&local_278,&local_2b8);
            UnicodeString::~UnicodeString(&local_2b8);
            UnicodeString::~UnicodeString(&local_278);
          }
          outArray = outArray + 1;
        }
      }
    }
    LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&unitsBundle);
    ResourceSink::~ResourceSink(&sink.super_ResourceSink);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      simpleFormatsToModifiers(this,local_238,UNUM_CURRENCY_FIELD,status);
    }
    else {
      this = (LongNameHandler *)0x0;
    }
    lVar1 = 0x1c0;
    do {
      UnicodeString::~UnicodeString
                ((UnicodeString *)
                 ((long)&local_238[0].super_Replaceable.super_UObject._vptr_UObject + lVar1));
      lVar1 = lVar1 + -0x40;
    } while (lVar1 != -0x40);
  }
  return this;
}

Assistant:

LongNameHandler* LongNameHandler::forCurrencyLongNames(const Locale &loc, const CurrencyUnit &currency,
                                                      const PluralRules *rules,
                                                      const MicroPropsGenerator *parent,
                                                      UErrorCode &status) {
    auto* result = new LongNameHandler(rules, parent);
    if (result == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return nullptr;
    }
    UnicodeString simpleFormats[ARRAY_LENGTH];
    getCurrencyLongNameData(loc, currency, simpleFormats, status);
    if (U_FAILURE(status)) { return nullptr; }
    result->simpleFormatsToModifiers(simpleFormats, UNUM_CURRENCY_FIELD, status);
    return result;
}